

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkValidatorUtils.hpp
# Opt level: O2

Result * CoreML::validateInputCount
                   (Result *__return_storage_ptr__,NeuralNetworkLayer *layer,int min,int max)

{
  string local_1c0;
  string local_1a0;
  string local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  string err;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  if (-1 < max && max < min) {
    __assert_fail("min <= max || max < 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/src/Validation/NeuralNetwork/NeuralNetworkValidatorUtils.hpp"
                  ,0x62,
                  "Result CoreML::validateInputCount(const Specification::NeuralNetworkLayer &, int, int)"
                 );
  }
  err._M_dataplus._M_p = (pointer)&err.field_2;
  err._M_string_length = 0;
  err.field_2._M_local_buf[0] = '\0';
  if ((max == min && 0 < max) && ((layer->input_).super_RepeatedPtrFieldBase.current_size_ != min))
  {
    std::__cxx11::string::string
              ((string *)&local_160,
               (string *)((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
    std::operator+(&local_140,"Layer \'",&local_160);
    std::operator+(&local_120,&local_140,"\' of type ");
    std::__cxx11::to_string(&local_180,layer->_oneof_case_[0]);
    std::operator+(&local_100,&local_120,&local_180);
    std::operator+(&local_e0,&local_100," has ");
    std::__cxx11::to_string(&local_1a0,(layer->input_).super_RepeatedPtrFieldBase.current_size_);
    std::operator+(&local_c0,&local_e0,&local_1a0);
    std::operator+(&local_a0,&local_c0," inputs but expects exactly ");
    std::__cxx11::to_string(&local_1c0,min);
    std::operator+(&local_80,&local_a0,&local_1c0);
    std::operator+(&local_40,&local_80,".");
  }
  else if ((min < 1) || (min <= (layer->input_).super_RepeatedPtrFieldBase.current_size_)) {
    if ((max < 1) || ((layer->input_).super_RepeatedPtrFieldBase.current_size_ <= max)) {
      Result::Result(__return_storage_ptr__);
      goto LAB_002b3389;
    }
    std::__cxx11::string::string
              ((string *)&local_160,
               (string *)((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
    std::operator+(&local_140,"Layer \'",&local_160);
    std::operator+(&local_120,&local_140,"\' of type ");
    std::__cxx11::to_string(&local_180,layer->_oneof_case_[0]);
    std::operator+(&local_100,&local_120,&local_180);
    std::operator+(&local_e0,&local_100," has ");
    std::__cxx11::to_string(&local_1a0,(layer->input_).super_RepeatedPtrFieldBase.current_size_);
    std::operator+(&local_c0,&local_e0,&local_1a0);
    std::operator+(&local_a0,&local_c0," inputs but expects at most ");
    std::__cxx11::to_string(&local_1c0,max);
    std::operator+(&local_80,&local_a0,&local_1c0);
    std::operator+(&local_40,&local_80,".");
  }
  else {
    std::__cxx11::string::string
              ((string *)&local_160,
               (string *)((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
    std::operator+(&local_140,"Layer \'",&local_160);
    std::operator+(&local_120,&local_140,"\' of type ");
    std::__cxx11::to_string(&local_180,layer->_oneof_case_[0]);
    std::operator+(&local_100,&local_120,&local_180);
    std::operator+(&local_e0,&local_100," has ");
    std::__cxx11::to_string(&local_1a0,(layer->input_).super_RepeatedPtrFieldBase.current_size_);
    std::operator+(&local_c0,&local_e0,&local_1a0);
    std::operator+(&local_a0,&local_c0," inputs but expects at least ");
    std::__cxx11::to_string(&local_1c0,min);
    std::operator+(&local_80,&local_a0,&local_1c0);
    std::operator+(&local_40,&local_80,".");
  }
  std::__cxx11::string::operator=((string *)&err,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_180);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::~string((string *)&local_160);
  Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err);
LAB_002b3389:
  std::__cxx11::string::~string((string *)&err);
  return __return_storage_ptr__;
}

Assistant:

inline Result validateInputCount(const Specification::NeuralNetworkLayer& layer, int min, int max) {

    assert( min <= max || max < 0 );
    std::string err;

    if (max > 0 && max == min && layer.input_size() != max) {
        err = "Layer '" + std::string(layer.name()) + "' of type " + std::to_string(layer.layer_case()) + " has " + std::to_string(layer.input_size()) + " inputs but expects exactly " + std::to_string(min) + ".";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    else if (min > 0 && layer.input_size() < min) {
        err = "Layer '" + std::string(layer.name()) + "' of type " + std::to_string(layer.layer_case()) + + " has " + std::to_string(layer.input_size()) + " inputs but expects at least " + std::to_string(min) + ".";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    else if (max > 0 && layer.input_size() > max) {
        err = "Layer '" + std::string(layer.name()) + "' of type " + std::to_string(layer.layer_case()) + + " has " + std::to_string(layer.input_size()) + " inputs but expects at most " + std::to_string(max) + ".";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    else {
        return Result();
    }
}